

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_MBCSLoad(UConverterSharedData *sharedData,UConverterLoadArgs *pArgs,uint8_t *raw,
                  UErrorCode *pErrorCode)

{
  char cVar1;
  ushort uVar2;
  int32_t *piVar3;
  uint16_t *puVar4;
  UConverterStaticData *pUVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uint8_t uVar9;
  ulong uVar10;
  UConverterSharedData *sharedData_00;
  uint16_t *puVar11;
  int32_t (*__dest) [256];
  long lVar12;
  long lVar13;
  UConverterMBCSTable *mbcsTable;
  int iVar14;
  uint8_t *puVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  UDataInfo info;
  int8_t stateProps [128];
  void *in_stack_fffffffffffffef8;
  UConverterMBCSTable *pUVar30;
  UDataInfo local_cc;
  undefined1 local_b8 [10];
  int16_t iStack_ae;
  uint32_t uStack_ac;
  undefined8 local_a8;
  undefined1 auStack_a0 [16];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (*raw == '\x05') {
    if ((raw[1] < 3) || (uVar20 = *(uint *)(raw + 0x20), (uVar20 & 0xff80) != 0)) goto LAB_003458ea;
    bVar17 = (uVar20 & 0x40) == 0;
    uVar21 = *(uint *)(raw + 0x18);
    (sharedData->mbcs).outputType = (uint8_t)uVar21;
    if ((uint8_t)uVar21 == '\0' && !bVar17) goto LAB_003458ea;
    uVar10 = (ulong)((uVar20 & 0x3f) << 2);
  }
  else {
    if (*raw != '\x04') goto LAB_003458ea;
    uVar21 = *(uint *)(raw + 0x18);
    (sharedData->mbcs).outputType = (uint8_t)uVar21;
    bVar17 = true;
    uVar10 = 0x20;
  }
  puVar15 = &(sharedData->mbcs).outputType;
  if (0xff < uVar21) {
    (sharedData->mbcs).extIndexes = (int32_t *)(raw + (uVar21 >> 8));
  }
  if (0xe < (byte)uVar21) goto LAB_003458ea;
  mbcsTable = &sharedData->mbcs;
  if ((0x130fU >> (uVar21 & 0x1f) & 1) != 0) {
    if (pArgs->onlyTestIsLoadable != '\0') {
      return;
    }
    uVar20 = *(uint *)(raw + 4);
    (sharedData->mbcs).countStates = (uint8_t)uVar20;
    (sharedData->mbcs).countToUFallbacks = *(uint32_t *)(raw + 8);
    (sharedData->mbcs).stateTable = (int32_t (*) [256])(raw + uVar10);
    (sharedData->mbcs).toUFallbacks =
         (_MBCSToUFallback *)((int32_t (*) [256])(raw + uVar10) + uVar20);
    (sharedData->mbcs).unicodeCodeUnits = (uint16_t *)(raw + *(uint *)(raw + 0xc));
    (sharedData->mbcs).fromUnicodeTable = (uint16_t *)(raw + *(uint *)(raw + 0x10));
    (sharedData->mbcs).fromUnicodeBytes = raw + *(uint *)(raw + 0x14);
    (sharedData->mbcs).fromUBytesLength = *(uint32_t *)(raw + 0x1c);
    local_cc.size = 0x14;
    udata_getInfo_63((UDataMemory *)sharedData->dataMemory,&local_cc);
    if ((local_cc.formatVersion[0] < 7) &&
       ((local_cc.formatVersion[0] != 6 || (local_cc.formatVersion[1] == '\0')))) {
      (sharedData->mbcs).unicodeMask = '\x03';
      bVar8 = 3;
    }
    else {
      bVar8 = sharedData->staticData->unicodeMask & 3;
      (sharedData->mbcs).unicodeMask = bVar8;
      if ((2 < raw[1]) && (bVar8 < 2)) {
        if (mbcsTable->countStates == '\x01') {
          if (0xe < raw[2]) {
            (sharedData->mbcs).utf8Friendly = '\x01';
            puVar11 = (sharedData->mbcs).fromUnicodeTable;
            uVar20 = 0;
            uVar10 = 0;
            do {
              (sharedData->mbcs).sbcsIndex[uVar10] =
                   puVar11[(ulong)(uVar20 & 0x3c) + (ulong)puVar11[uVar10 >> 4 & 0xfffffff]];
              uVar10 = uVar10 + 1;
              uVar20 = uVar20 + 4;
            } while (uVar10 != 0x40);
            (sharedData->mbcs).maxFastUChar = L'࿿';
          }
        }
        else if (0xd6 < raw[2]) {
          (sharedData->mbcs).utf8Friendly = '\x01';
          if (bVar17) {
            uVar10 = (ulong)(sharedData->mbcs).fromUBytesLength;
          }
          else {
            uVar10 = 0;
          }
          (sharedData->mbcs).mbcsIndex = (uint16_t *)((sharedData->mbcs).fromUnicodeBytes + uVar10);
          (sharedData->mbcs).maxFastUChar = (ushort)raw[2] << 8 | 0xff;
        }
      }
    }
    uVar20 = 0;
    uVar21 = 1;
    uVar22 = 2;
    uVar23 = 3;
    lVar12 = 0;
    uVar27 = 0xffffffff;
    uVar24 = 0xffffffff;
    uVar25 = 0xffffffff;
    uVar26 = 0xffffffff;
    auVar18 = _DAT_0039a8f0;
    auVar19 = _DAT_00399dc0;
    do {
      piVar3 = *(sharedData->mbcs).stateTable + lVar12;
      auVar28 = auVar19 | _DAT_003e6380;
      auVar29 = auVar18 | _DAT_003e6380;
      uVar24 = uVar24 & ((int)(float)((uVar20 >> 2) * 0x800000 + 0x3f800000) ^ 0xffffffffU |
                        -(uint)(auVar28._4_4_ == 0 && *piVar3 == auVar28._0_4_));
      uVar25 = uVar25 & ((int)(float)((uVar21 >> 2) * 0x800000 + 0x3f800000) ^ 0xffffffffU |
                        -(uint)(piVar3[1] == auVar28._8_4_ && auVar28._12_4_ == 0));
      uVar26 = uVar26 & ((int)(float)((uVar22 >> 2) * 0x800000 + 0x3f800000) ^ 0xffffffffU |
                        -(uint)(auVar29._4_4_ == 0 && piVar3[2] == auVar29._0_4_));
      uVar27 = uVar27 & ((int)(float)((uVar23 >> 2) * 0x800000 + 0x3f800000) ^ 0xffffffffU |
                        -(uint)(piVar3[3] == auVar29._8_4_ && auVar29._12_4_ == 0));
      lVar12 = lVar12 + 4;
      lVar13 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar13 + 4;
      lVar13 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar13 + 4;
      uVar20 = uVar20 + 4;
      uVar21 = uVar21 + 4;
      uVar22 = uVar22 + 4;
      uVar23 = uVar23 + 4;
    } while (lVar12 != 0x80);
    (sharedData->mbcs).asciiRoundtrips = uVar27 & uVar25 & uVar26 & uVar24;
    if (!bVar17) {
      iVar14 = *(int *)(raw + 0x10);
      iVar16 = *(int *)(raw + 0x14);
      uVar21 = *(uint *)(raw + 0x24);
      uVar20 = (bVar8 & 1) * 0x800 + 0x80;
      uVar10 = (ulong)(uVar20 + uVar21 * 4 + (sharedData->mbcs).fromUBytesLength);
      puVar11 = (uint16_t *)uprv_malloc_63(uVar10);
      (sharedData->mbcs).reconstitutedData = (uint8_t *)puVar11;
      if (puVar11 == (uint16_t *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uVar23 = (bVar8 & 1) << 10 | 0x40;
        uVar22 = uVar23 >> 1;
        iVar14 = ((uint)(iVar16 - iVar14) >> 2) - uVar22;
        iVar16 = 0;
        memset(puVar11,0,uVar10);
        puVar4 = (sharedData->mbcs).fromUnicodeTable;
        memcpy(puVar11,puVar4,(ulong)uVar20);
        uVar10 = (ulong)(uVar23 * 2);
        memcpy((uint8_t *)((long)puVar11 + (ulong)(uVar21 - iVar14) * 4 + uVar10),
               (void *)((long)puVar4 + uVar10),(ulong)(uint)(iVar14 * 4));
        (sharedData->mbcs).fromUnicodeTable = puVar11;
        (sharedData->mbcs).fromUnicodeBytes =
             (uint8_t *)((long)puVar11 + (ulong)uVar21 * 4 + uVar10);
        uVar20 = (uint)(ushort)(sharedData->mbcs).maxFastUChar;
        if (0x3e < uVar20) {
          lVar12 = 0;
          do {
            uVar10 = (ulong)puVar11[lVar12];
            if (uVar22 != puVar11[lVar12]) {
              puVar4 = (sharedData->mbcs).mbcsIndex;
              lVar13 = 0;
              do {
                uVar2 = *(ushort *)((long)puVar4 + lVar13 + (long)iVar16 * 2);
                if (uVar2 != 0) {
                  uVar21 = (uint)(uVar2 >> 4);
                  *(uint *)(puVar11 + uVar10 * 2 + lVar13 * 4) = uVar21;
                  *(uint *)(puVar11 + uVar10 * 2 + lVar13 * 4 + 2) = uVar21 + 1;
                  *(uint *)(puVar11 + uVar10 * 2 + lVar13 * 4 + 4) = uVar21 + 2;
                  *(uint *)(puVar11 + uVar10 * 2 + lVar13 * 4 + 6) = uVar21 + 3;
                }
                lVar13 = lVar13 + 2;
              } while ((int)lVar13 != 0x20);
            }
            iVar16 = iVar16 + 0x10;
            lVar12 = lVar12 + 1;
          } while (iVar16 < (int)(uVar20 + 1 >> 6));
        }
        local_48 = 0xffffffff;
        uStack_44 = 0xffffffff;
        uStack_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        local_58 = 0xffffffff;
        uStack_54 = 0xffffffff;
        uStack_50 = 0xffffffff;
        uStack_4c = 0xffffffff;
        local_68 = 0xffffffff;
        uStack_64 = 0xffffffff;
        uStack_60 = 0xffffffff;
        uStack_5c = 0xffffffff;
        local_78 = 0xffffffff;
        uStack_74 = 0xffffffff;
        uStack_70 = 0xffffffff;
        uStack_6c = 0xffffffff;
        local_88 = 0xffffffff;
        uStack_84 = 0xffffffff;
        uStack_80 = 0xffffffff;
        uStack_7c = 0xffffffff;
        auStack_a0._8_4_ = 0xffffffff;
        auStack_a0._12_4_ = 0xffffffff;
        uStack_90 = 0xffffffff;
        uStack_8c = 0xffffffff;
        local_a8._0_4_ = 0xffffffff;
        local_a8._4_4_ = 0xffffffff;
        auStack_a0._0_8_ = 0xffffffffffffffff;
        local_b8._0_4_ = -1;
        local_b8._4_4_ = -1;
        stack0xffffffffffffff50 = 0xffffffffffffffff;
        pUVar30 = mbcsTable;
        getStateProp((sharedData->mbcs).stateTable,local_b8,0);
        bVar8 = (sharedData->mbcs).countStates;
        if (bVar8 != 0) {
          uVar10 = 0;
          do {
            if ('?' < (char)local_b8[uVar10]) {
              enumToU(mbcsTable,local_b8,(int32_t)uVar10,0,0,(UConverterEnumToUCallback *)mbcsTable,
                      in_stack_fffffffffffffef8,(UErrorCode *)pUVar30);
              bVar8 = mbcsTable->countStates;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < bVar8);
        }
      }
    }
    goto LAB_00345c4e;
  }
  if ((uVar21 & 0xff) != 0xe) {
LAB_003458ea:
    *pErrorCode = U_INVALID_TABLE_FORMAT;
    return;
  }
  auStack_a0 = (undefined1  [16])0x0;
  stack0xffffffffffffff50 = (undefined1  [16])0x0;
  piVar3 = (sharedData->mbcs).extIndexes;
  if (piVar3 == (int32_t *)0x0) goto LAB_003458ea;
  if (pArgs->nestedLoads != 1) {
    *pErrorCode = U_INVALID_TABLE_FILE;
    return;
  }
  iVar14 = strcmp((char *)(raw + uVar10),sharedData->staticData->name);
  if (iVar14 == 0) goto LAB_003458ea;
  local_b8._0_4_ = 0x28;
  local_b8._4_4_ = 2;
  local_b8[8] = pArgs->onlyTestIsLoadable;
  iStack_ae = pArgs->reserved;
  uStack_ac = pArgs->options;
  local_a8 = pArgs->pkg;
  auStack_a0._0_8_ = raw + uVar10;
  sharedData_00 = ucnv_load_63((UConverterLoadArgs *)local_b8,pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if ((sharedData_00->staticData->conversionType != '\x02') ||
     ((sharedData_00->mbcs).baseSharedData != (UConverterSharedData *)0x0)) {
    ucnv_unload_63(sharedData_00);
    goto LAB_003458ea;
  }
  if (pArgs->onlyTestIsLoadable != '\0') {
    ucnv_unload_63(sharedData_00);
    return;
  }
  pUVar30 = mbcsTable;
  memcpy(mbcsTable,&sharedData_00->mbcs,0xd8);
  (sharedData->mbcs).baseSharedData = sharedData_00;
  (sharedData->mbcs).extIndexes = piVar3;
  (sharedData->mbcs).swapLFNLStateTable = (int32_t (*) [256])0x0;
  (sharedData->mbcs).swapLFNLFromUnicodeBytes = (uint8_t *)0x0;
  (sharedData->mbcs).reconstitutedData = (uint8_t *)0x0;
  (sharedData->mbcs).swapLFNLName = (char *)0x0;
  cVar1 = sharedData->staticData->conversionType;
  if ((cVar1 == '\x01') || ((cVar1 == '\x02' && ('\x01' < sharedData->staticData->minBytesPerChar)))
     ) {
    if ((sharedData_00->mbcs).outputType == '\f') {
      uVar20 = (*(sharedData->mbcs).stateTable)[0xe];
      if (((uVar20 & 0x80f00000) == 0x80800000) && (uVar20 = uVar20 >> 0x18 & 0x7f, uVar20 != 0)) {
        (sharedData->mbcs).dbcsOnlyState = (uint8_t)uVar20;
        mbcsTable = pUVar30;
LAB_00345d4b:
        *puVar15 = 0xdb;
      }
    }
    else {
      pUVar5 = sharedData_00->staticData;
      if ((((pUVar5->conversionType == '\x02') && (pUVar5->minBytesPerChar == '\x01')) &&
          (pUVar5->maxBytesPerChar == '\x02')) && (bVar8 = mbcsTable->countStates, -1 < (char)bVar8)
         ) {
        __dest = (int32_t (*) [256])uprv_malloc_63((ulong)((bVar8 + 1) * 0x400));
        if (__dest == (int32_t (*) [256])0x0) {
          ucnv_unload_63(sharedData_00);
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          return;
        }
        memcpy(__dest,(sharedData->mbcs).stateTable,(ulong)bVar8 << 10);
        iVar14 = (uint)bVar8 << 0x18;
        lVar12 = 0;
        do {
          piVar3 = *__dest + lVar12;
          iVar16 = piVar3[1];
          iVar6 = piVar3[2];
          iVar7 = piVar3[3];
          if (*piVar3 < 0) {
            (*__dest)[lVar12] = iVar14;
          }
          if (iVar16 < 0) {
            (*__dest)[lVar12 + 1] = iVar14;
          }
          if (iVar6 < 0) {
            (*__dest)[lVar12 + 2] = iVar14;
          }
          if (iVar7 < 0) {
            (*__dest)[lVar12 + 3] = iVar14;
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x100);
        lVar12 = 0;
        do {
          piVar3 = __dest[bVar8] + lVar12;
          piVar3[0] = -0x7f900000;
          piVar3[1] = -0x7f900000;
          piVar3[2] = -0x7f900000;
          piVar3[3] = -0x7f900000;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x100);
        (sharedData->mbcs).stateTable = __dest;
        (sharedData->mbcs).countStates = (uint8_t)(bVar8 + 1);
        (sharedData->mbcs).stateTableOwned = '\x01';
        mbcsTable = pUVar30;
        goto LAB_00345d4b;
      }
    }
  }
LAB_00345c4e:
  if ((sharedData->mbcs).utf8Friendly != '\0') {
    if (mbcsTable->countStates != '\x01') {
      uVar9 = *puVar15;
      if (uVar9 == '\x01') {
        sharedData->impl = &_DBCSUTF8Impl;
        return;
      }
      goto LAB_00345c6c;
    }
    sharedData->impl = &_SBCSUTF8Impl;
  }
  uVar9 = *puVar15;
LAB_00345c6c:
  if ((uVar9 != 0xdb) && (uVar9 != '\f')) {
    return;
  }
  (sharedData->mbcs).asciiRoundtrips = 0;
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSLoad(UConverterSharedData *sharedData,
          UConverterLoadArgs *pArgs,
          const uint8_t *raw,
          UErrorCode *pErrorCode) {
    UDataInfo info;
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;
    _MBCSHeader *header=(_MBCSHeader *)raw;
    uint32_t offset;
    uint32_t headerLength;
    UBool noFromU=FALSE;

    if(header->version[0]==4) {
        headerLength=MBCS_HEADER_V4_LENGTH;
    } else if(header->version[0]==5 && header->version[1]>=3 &&
              (header->options&MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0) {
        headerLength=header->options&MBCS_OPT_LENGTH_MASK;
        noFromU=(UBool)((header->options&MBCS_OPT_NO_FROM_U)!=0);
    } else {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    mbcsTable->outputType=(uint8_t)header->flags;
    if(noFromU && mbcsTable->outputType==MBCS_OUTPUT_1) {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    /* extension data, header version 4.2 and higher */
    offset=header->flags>>8;
    if(offset!=0) {
        mbcsTable->extIndexes=(const int32_t *)(raw+offset);
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_EXT_ONLY) {
        UConverterLoadArgs args=UCNV_LOAD_ARGS_INITIALIZER;
        UConverterSharedData *baseSharedData;
        const int32_t *extIndexes;
        const char *baseName;

        /* extension-only file, load the base table and set values appropriately */
        if((extIndexes=mbcsTable->extIndexes)==NULL) {
            /* extension-only file without extension */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        if(pArgs->nestedLoads!=1) {
            /* an extension table must not be loaded as a base table */
            *pErrorCode=U_INVALID_TABLE_FILE;
            return;
        }

        /* load the base table */
        baseName=(const char *)header+headerLength*4;
        if(0==uprv_strcmp(baseName, sharedData->staticData->name)) {
            /* forbid loading this same extension-only file */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        /* TODO parse package name out of the prefix of the base name in the extension .cnv file? */
        args.size=sizeof(UConverterLoadArgs);
        args.nestedLoads=2;
        args.onlyTestIsLoadable=pArgs->onlyTestIsLoadable;
        args.reserved=pArgs->reserved;
        args.options=pArgs->options;
        args.pkg=pArgs->pkg;
        args.name=baseName;
        baseSharedData=ucnv_load(&args, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
        if( baseSharedData->staticData->conversionType!=UCNV_MBCS ||
            baseSharedData->mbcs.baseSharedData!=NULL
        ) {
            ucnv_unload(baseSharedData);
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            ucnv_unload(baseSharedData);
            return;
        }

        /* copy the base table data */
        uprv_memcpy(mbcsTable, &baseSharedData->mbcs, sizeof(UConverterMBCSTable));

        /* overwrite values with relevant ones for the extension converter */
        mbcsTable->baseSharedData=baseSharedData;
        mbcsTable->extIndexes=extIndexes;

        /*
         * It would be possible to share the swapLFNL data with a base converter,
         * but the generated name would have to be different, and the memory
         * would have to be free'd only once.
         * It is easier to just create the data for the extension converter
         * separately when it is requested.
         */
        mbcsTable->swapLFNLStateTable=NULL;
        mbcsTable->swapLFNLFromUnicodeBytes=NULL;
        mbcsTable->swapLFNLName=NULL;

        /*
         * The reconstitutedData must be deleted only when the base converter
         * is unloaded.
         */
        mbcsTable->reconstitutedData=NULL;

        /*
         * Set a special, runtime-only outputType if the extension converter
         * is a DBCS version of a base converter that also maps single bytes.
         */
        if( sharedData->staticData->conversionType==UCNV_DBCS ||
                (sharedData->staticData->conversionType==UCNV_MBCS &&
                 sharedData->staticData->minBytesPerChar>=2)
        ) {
            if(baseSharedData->mbcs.outputType==MBCS_OUTPUT_2_SISO) {
                /* the base converter is SI/SO-stateful */
                int32_t entry;

                /* get the dbcs state from the state table entry for SO=0x0e */
                entry=mbcsTable->stateTable[0][0xe];
                if( MBCS_ENTRY_IS_FINAL(entry) &&
                    MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_CHANGE_ONLY &&
                    MBCS_ENTRY_FINAL_STATE(entry)!=0
                ) {
                    mbcsTable->dbcsOnlyState=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry);

                    mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
                }
            } else if(
                baseSharedData->staticData->conversionType==UCNV_MBCS &&
                baseSharedData->staticData->minBytesPerChar==1 &&
                baseSharedData->staticData->maxBytesPerChar==2 &&
                mbcsTable->countStates<=127
            ) {
                /* non-stateful base converter, need to modify the state table */
                int32_t (*newStateTable)[256];
                int32_t *state;
                int32_t i, count;

                /* allocate a new state table and copy the base state table contents */
                count=mbcsTable->countStates;
                newStateTable=(int32_t (*)[256])uprv_malloc((count+1)*1024);
                if(newStateTable==NULL) {
                    ucnv_unload(baseSharedData);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return;
                }

                uprv_memcpy(newStateTable, mbcsTable->stateTable, count*1024);

                /* change all final single-byte entries to go to a new all-illegal state */
                state=newStateTable[0];
                for(i=0; i<256; ++i) {
                    if(MBCS_ENTRY_IS_FINAL(state[i])) {
                        state[i]=MBCS_ENTRY_TRANSITION(count, 0);
                    }
                }

                /* build the new all-illegal state */
                state=newStateTable[count];
                for(i=0; i<256; ++i) {
                    state[i]=MBCS_ENTRY_FINAL(0, MBCS_STATE_ILLEGAL, 0);
                }
                mbcsTable->stateTable=(const int32_t (*)[256])newStateTable;
                mbcsTable->countStates=(uint8_t)(count+1);
                mbcsTable->stateTableOwned=TRUE;

                mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
            }
        }

        /*
         * unlike below for files with base tables, do not get the unicodeMask
         * from the sharedData; instead, use the base table's unicodeMask,
         * which we copied in the memcpy above;
         * this is necessary because the static data unicodeMask, especially
         * the UCNV_HAS_SUPPLEMENTARY flag, is part of the base table data
         */
    } else {
        /* conversion file with a base table; an additional extension table is optional */
        /* make sure that the output type is known */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
            /* OK */
            break;
        default:
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            return;
        }

        mbcsTable->countStates=(uint8_t)header->countStates;
        mbcsTable->countToUFallbacks=header->countToUFallbacks;
        mbcsTable->stateTable=(const int32_t (*)[256])(raw+headerLength*4);
        mbcsTable->toUFallbacks=(const _MBCSToUFallback *)(mbcsTable->stateTable+header->countStates);
        mbcsTable->unicodeCodeUnits=(const uint16_t *)(raw+header->offsetToUCodeUnits);

        mbcsTable->fromUnicodeTable=(const uint16_t *)(raw+header->offsetFromUTable);
        mbcsTable->fromUnicodeBytes=(const uint8_t *)(raw+header->offsetFromUBytes);
        mbcsTable->fromUBytesLength=header->fromUBytesLength;

        /*
         * converter versions 6.1 and up contain a unicodeMask that is
         * used here to select the most efficient function implementations
         */
        info.size=sizeof(UDataInfo);
        udata_getInfo((UDataMemory *)sharedData->dataMemory, &info);
        if(info.formatVersion[0]>6 || (info.formatVersion[0]==6 && info.formatVersion[1]>=1)) {
            /* mask off possible future extensions to be safe */
            mbcsTable->unicodeMask=(uint8_t)(sharedData->staticData->unicodeMask&3);
        } else {
            /* for older versions, assume worst case: contains anything possible (prevent over-optimizations) */
            mbcsTable->unicodeMask=UCNV_HAS_SUPPLEMENTARY|UCNV_HAS_SURROGATES;
        }

        /*
         * _MBCSHeader.version 4.3 adds utf8Friendly data structures.
         * Check for the header version, SBCS vs. MBCS, and for whether the
         * data structures are optimized for code points as high as what the
         * runtime code is designed for.
         * The implementation does not handle mapping tables with entries for
         * unpaired surrogates.
         */
        if( header->version[1]>=3 &&
            (mbcsTable->unicodeMask&UCNV_HAS_SURROGATES)==0 &&
            (mbcsTable->countStates==1 ?
                (header->version[2]>=(SBCS_FAST_MAX>>8)) :
                (header->version[2]>=(MBCS_FAST_MAX>>8))
            )
        ) {
            mbcsTable->utf8Friendly=TRUE;

            if(mbcsTable->countStates==1) {
                /*
                 * SBCS: Stage 3 is allocated in 64-entry blocks for U+0000..SBCS_FAST_MAX or higher.
                 * Build a table with indexes to each block, to be used instead of
                 * the regular stage 1/2 table.
                 */
                int32_t i;
                for(i=0; i<(SBCS_FAST_LIMIT>>6); ++i) {
                    mbcsTable->sbcsIndex[i]=mbcsTable->fromUnicodeTable[mbcsTable->fromUnicodeTable[i>>4]+((i<<2)&0x3c)];
                }
                /* set SBCS_FAST_MAX to reflect the reach of sbcsIndex[] even if header->version[2]>(SBCS_FAST_MAX>>8) */
                mbcsTable->maxFastUChar=SBCS_FAST_MAX;
            } else {
                /*
                 * MBCS: Stage 3 is allocated in 64-entry blocks for U+0000..MBCS_FAST_MAX or higher.
                 * The .cnv file is prebuilt with an additional stage table with indexes
                 * to each block.
                 */
                mbcsTable->mbcsIndex=(const uint16_t *)
                    (mbcsTable->fromUnicodeBytes+
                     (noFromU ? 0 : mbcsTable->fromUBytesLength));
                mbcsTable->maxFastUChar=(((UChar)header->version[2])<<8)|0xff;
            }
        }

        /* calculate a bit set of 4 ASCII characters per bit that round-trip to ASCII bytes */
        {
            uint32_t asciiRoundtrips=0xffffffff;
            int32_t i;

            for(i=0; i<0x80; ++i) {
                if(mbcsTable->stateTable[0][i]!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, i)) {
                    asciiRoundtrips&=~((uint32_t)1<<(i>>2));
                }
            }
            mbcsTable->asciiRoundtrips=asciiRoundtrips;
        }

        if(noFromU) {
            uint32_t stage1Length=
                mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY ?
                    0x440 : 0x40;
            uint32_t stage2Length=
                (header->offsetFromUBytes-header->offsetFromUTable)/4-
                stage1Length/2;
            reconstituteData(mbcsTable, stage1Length, stage2Length, header->fullStage2Length, pErrorCode);
        }
    }

    /* Set the impl pointer here so that it is set for both extension-only and base tables. */
    if(mbcsTable->utf8Friendly) {
        if(mbcsTable->countStates==1) {
            sharedData->impl=&_SBCSUTF8Impl;
        } else {
            if(mbcsTable->outputType==MBCS_OUTPUT_2) {
                sharedData->impl=&_DBCSUTF8Impl;
            }
        }
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_DBCS_ONLY || mbcsTable->outputType==MBCS_OUTPUT_2_SISO) {
        /*
         * MBCS_OUTPUT_DBCS_ONLY: No SBCS mappings, therefore ASCII does not roundtrip.
         * MBCS_OUTPUT_2_SISO: Bypass the ASCII fastpath to handle prevLength correctly.
         */
        mbcsTable->asciiRoundtrips=0;
    }
}